

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O1

void AssertCorrectModifiersInTemplate(Template *tpl,string *text,string *expected_out)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  string out;
  string dump_out;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  if (tpl == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0xea,"tpl");
    __assert_fail("tpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0xea,
                  "void AssertCorrectModifiersInTemplate(Template *, const string &, const string &)"
                 );
  }
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  ctemplate::Template::DumpToString((char *)tpl,(string *)"bogus_filename");
  uVar3 = 0;
  while( true ) {
    lVar2 = std::__cxx11::string::find((char *)&local_50,0x12778c,uVar3);
    if (lVar2 == -1) break;
    uVar3 = lVar2 + 0xf;
    std::__cxx11::string::find((char *)&local_50,0x1253d6,uVar3);
    std::__cxx11::string::substr((ulong)local_70,(ulong)&local_50);
    std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70[0]);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    std::__cxx11::string::append((char *)&local_90);
  }
  bVar1 = anon_unknown.dwarf_20574::StrEqVerbose(expected_out,&local_90,text);
  if (bVar1) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    return;
  }
  printf("ASSERT FAILED, line %d: %s\n",0xf5,"StrEqVerbose(expected_out, out, text)");
  bVar1 = anon_unknown.dwarf_20574::StrEqVerbose(expected_out,&local_90,text);
  if (bVar1) {
    exit(1);
  }
  __assert_fail("StrEqVerbose(expected_out, out, text)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                ,0xf5,
                "void AssertCorrectModifiersInTemplate(Template *, const string &, const string &)")
  ;
}

Assistant:

static void AssertCorrectModifiersInTemplate(Template* tpl,
                                             const string& text,
                                             const string& expected_out) {
  ASSERT(tpl);
  string dump_out, out;
  tpl->DumpToString("bogus_filename", &dump_out);
  string::size_type i, j;
  i = 0;
  while ((i = dump_out.find("Variable Node: ", i)) != string::npos) {
    i += strlen("Variable Node: ");
    j = dump_out.find("\n", i);
    out.append(dump_out.substr(i, j - i));   // should be safe.
    out.append("\n");
  }
  ASSERT_STREQ_VERBOSE(expected_out, out, text);
}